

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

uint If_DsdManCheckPrime(If_DsdMan_t *p,int iFirst,uint uMaskNot,If_DsdObj_t *pObj,int nSuppAll,
                        int LutSize,int fDerive,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Vec_Int_t *vSets;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  byte bVar9;
  int i;
  uint nVars;
  int pSSizes [12];
  int pFirsts [12];
  
  iVar2 = If_DsdObjTruthId(p,pObj);
  nVars = *(uint *)&pObj->field_0x4 >> 0x1b;
  vSets = (Vec_Int_t *)Vec_PtrEntry(p->vTtDecs[nVars],iVar2);
  if (fVerbose != 0) {
    putchar(10);
    Dau_DecPrintSets(vSets,nVars);
  }
  if (*(uint *)&pObj->field_0x4 < 0x18000000) {
    __assert_fail("If_DsdObjFaninNum(pObj) > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x766,
                  "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                 );
  }
  if ((int)(*(uint *)&pObj->field_0x4 >> 3 & 0x1f) <= LutSize) {
    __assert_fail("If_DsdObjSuppSize(pObj) > LutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x767,
                  "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                 );
  }
  If_DsdManGetSuppSizes(p,pObj,pSSizes);
  iVar2 = ~nSuppAll + LutSize + (*(uint *)&pObj->field_0x4 >> 3 & 0x1f);
  if (LutSize <= iVar2) {
    __assert_fail("LimitOut < LutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                  ,0x76a,
                  "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                 );
  }
  i = 0;
  do {
    if (vSets->nSize <= i) {
      return 0;
    }
    iVar3 = Vec_IntEntry(vSets,i);
    iVar4 = 0;
    iVar7 = 0;
    for (uVar6 = 0; nVars * 2 != uVar6; uVar6 = uVar6 + 2) {
      switch(iVar3 >> ((byte)uVar6 & 0x1f) & 3) {
      case 0:
        iVar4 = iVar4 + *(int *)((long)pSSizes + uVar6 * 2);
        break;
      case 1:
        iVar7 = iVar7 + *(int *)((long)pSSizes + uVar6 * 2);
        break;
      case 2:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                      ,0x77a,
                      "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                     );
      case 3:
        iVar1 = *(int *)((long)pSSizes + uVar6 * 2);
        iVar7 = iVar7 + iVar1;
        iVar4 = iVar4 + iVar1;
      }
      if ((LutSize < iVar7) || (iVar2 < iVar4)) {
        if (nVars * 2 != (uint)uVar6) goto LAB_0038ace2;
        break;
      }
    }
    if (fDerive == 0) {
      return 0xffffffff;
    }
    If_DsdManComputeFirst(p,pObj,pFirsts);
    bVar9 = 0;
    uVar8 = 0;
    for (uVar6 = 0; nVars != uVar6; uVar6 = uVar6 + 1) {
      switch(iVar3 >> (bVar9 & 0x1f) & 3) {
      case 0:
        goto switchD_0038aca3_caseD_0;
      case 1:
        iVar4 = 0;
        break;
      case 2:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifDsd.c"
                      ,0x78d,
                      "unsigned int If_DsdManCheckPrime(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                     );
      case 3:
        iVar4 = 1;
      }
      uVar5 = If_DsdSign(p,pObj,(int)uVar6,pFirsts[uVar6] + iFirst,iVar4);
      uVar8 = uVar8 | uVar5;
switchD_0038aca3_caseD_0:
      bVar9 = bVar9 + 2;
    }
    if ((uMaskNot & uVar8) == 0) {
      return uVar8;
    }
LAB_0038ace2:
    i = i + 1;
  } while( true );
}

Assistant:

unsigned If_DsdManCheckPrime( If_DsdMan_t * p, int iFirst, unsigned uMaskNot, If_DsdObj_t * pObj, int nSuppAll, int LutSize, int fDerive, int fVerbose )
{
    int i, v, set, LimitOut, SizeIn, SizeOut, pSSizes[DAU_MAX_VAR], pFirsts[DAU_MAX_VAR];
    int truthId = If_DsdObjTruthId(p, pObj);
    int nFans = If_DsdObjFaninNum(pObj);
    Vec_Int_t * vSets = (Vec_Int_t *)Vec_PtrEntry(p->vTtDecs[pObj->nFans], truthId);
if ( fVerbose )
printf( "\n" );
if ( fVerbose )
Dau_DecPrintSets( vSets, nFans );
    assert( If_DsdObjFaninNum(pObj) > 2 );
    assert( If_DsdObjSuppSize(pObj) > LutSize );
    If_DsdManGetSuppSizes( p, pObj, pSSizes );
    LimitOut = LutSize - (nSuppAll - If_DsdObjSuppSize(pObj) + 1);
    assert( LimitOut < LutSize );
    Vec_IntForEachEntry( vSets, set, i )
    {
        SizeIn = SizeOut = 0;
        for ( v = 0; v < nFans; v++ )
        {
            int Value = ((set >> (v << 1)) & 3);
            if ( Value == 0 )
                SizeOut += pSSizes[v];
            else if ( Value == 1 )
                SizeIn += pSSizes[v];
            else if ( Value == 3 )
            {
                SizeIn += pSSizes[v];
                SizeOut += pSSizes[v];
            }
            else assert( 0 );
            if ( SizeIn > LutSize || SizeOut > LimitOut )
                break;
        }
        if ( v == nFans )
        {
            unsigned uRes = 0;
            if ( !fDerive )
                return ~0;
            If_DsdManComputeFirst( p, pObj, pFirsts );
            for ( v = 0; v < nFans; v++ )
            {
                int Value = ((set >> (v << 1)) & 3);
                if ( Value == 0 )
                {}
                else if ( Value == 1 )
                    uRes |= If_DsdSign(p, pObj, v, iFirst + pFirsts[v], 0);
                else if ( Value == 3 )
                    uRes |= If_DsdSign(p, pObj, v, iFirst + pFirsts[v], 1);
                else assert( 0 );
            }
            if ( uRes & uMaskNot )
                continue;
            return uRes;
        }
    }
    return 0;
}